

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  uint uVar1;
  float *pfVar2;
  unsigned_short *puVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImFontGlyph *pIVar9;
  ImFontGlyph *pIVar10;
  ImFontGlyph *pIVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  float *pfVar17;
  float fVar18;
  
  uVar13 = 0;
  for (lVar12 = 0; (ulong)(uint)(this->Glyphs).Size * 0x28 - lVar12 != 0; lVar12 = lVar12 + 0x28) {
    uVar14 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar12) >> 2;
    if (uVar13 <= uVar14) {
      uVar13 = uVar14;
    }
  }
  ImVector<float>::clear(&this->IndexAdvanceX);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar13 + 1);
  uVar14 = (this->Glyphs).Size;
  lVar12 = (long)(int)uVar14;
  pIVar11 = (this->Glyphs).Data;
  pfVar2 = (this->IndexAdvanceX).Data;
  puVar3 = (this->IndexLookup).Data;
  uVar15 = 0;
  uVar16 = 0;
  if (0 < (int)uVar14) {
    uVar16 = (ulong)uVar14;
  }
  pfVar17 = &pIVar11->AdvanceX;
  for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    uVar1 = *(uint *)(pfVar17 + -1);
    *(float *)((long)pfVar2 + (ulong)(uVar1 & 0xfffffffc)) = *pfVar17;
    puVar3[uVar1 >> 2] = (unsigned_short)uVar15;
    this->Used4kPagesMap[uVar1 >> 0x11] =
         this->Used4kPagesMap[uVar1 >> 0x11] | (byte)(1 << ((byte)(uVar1 >> 0xe) & 7));
    pfVar17 = pfVar17 + 10;
  }
  pIVar9 = FindGlyph(this,0x20);
  if (pIVar9 != (ImFontGlyph *)0x0) {
    if (((undefined1  [40])pIVar11[lVar12 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      ImVector<ImFontGlyph>::resize(&this->Glyphs,uVar14 + 1);
      pIVar11 = (this->Glyphs).Data;
      lVar12 = (long)(this->Glyphs).Size;
    }
    pIVar10 = FindGlyph(this,0x20);
    fVar18 = pIVar10->AdvanceX;
    fVar5 = pIVar10->X0;
    fVar6 = pIVar10->Y0;
    fVar7 = pIVar10->X1;
    fVar8 = pIVar10->Y1;
    uVar4 = *(undefined8 *)&pIVar10->U0;
    pIVar9 = pIVar11 + lVar12 + -1;
    *(undefined4 *)&pIVar9->field_0x0 = *(undefined4 *)&pIVar10->field_0x0;
    pIVar9->AdvanceX = fVar18;
    pIVar9->X0 = fVar5;
    pIVar9->Y0 = fVar6;
    pIVar9 = pIVar11 + lVar12 + -1;
    pIVar9->X1 = fVar7;
    pIVar9->Y1 = fVar8;
    *(undefined8 *)(&pIVar9->X1 + 2) = uVar4;
    fVar18 = pIVar10->V1;
    pIVar11[lVar12 + -1].U1 = pIVar10->U1;
    pIVar11[lVar12 + -1].V1 = fVar18;
    *(uint *)(pIVar11 + lVar12 + -1) = *(uint *)(pIVar11 + lVar12 + -1) & 3 | 0x24;
    fVar18 = pIVar11[lVar12 + -1].AdvanceX * 4.0;
    pIVar11[lVar12 + -1].AdvanceX = fVar18;
    (this->IndexAdvanceX).Data[9] = fVar18;
    (this->IndexLookup).Data[*(uint *)(pIVar11 + lVar12 + -1) >> 2] = (short)(this->Glyphs).Size - 1
    ;
  }
  SetGlyphVisible(this,0x20,false);
  SetGlyphVisible(this,9,false);
  pIVar11 = FindGlyphNoFallback(this,this->FallbackChar);
  this->FallbackGlyph = pIVar11;
  fVar18 = 0.0;
  if (pIVar11 != (ImFontGlyph *)0x0) {
    fVar18 = pIVar11->AdvanceX;
  }
  this->FallbackAdvanceX = fVar18;
  pfVar2 = (this->IndexAdvanceX).Data;
  for (uVar15 = 0; uVar13 + 1 != uVar15; uVar15 = uVar15 + 1) {
    pfVar17 = pfVar2 + uVar15;
    if (*pfVar17 <= 0.0 && *pfVar17 != 0.0) {
      pfVar2[uVar15] = fVar18;
    }
  }
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}